

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

void read_global_config(char *config)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  
  lVar3 = al_load_config_file();
  if (lVar3 == 0) {
    lVar3 = al_create_config();
  }
  iVar1 = fullscreen;
  pcVar4 = (char *)al_get_config_value(lVar3,"GFX","fullscreen");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  iVar2 = bit_depth;
  fullscreen = iVar1;
  pcVar4 = (char *)al_get_config_value(lVar3,"GFX","bit_depth");
  if (pcVar4 != (char *)0x0) {
    iVar2 = atoi(pcVar4);
  }
  iVar1 = screen_width;
  bit_depth = iVar2;
  pcVar4 = (char *)al_get_config_value(lVar3,"GFX","screen_width");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  iVar2 = screen_height;
  screen_width = iVar1;
  pcVar4 = (char *)al_get_config_value(lVar3,"GFX","screen_height");
  if (pcVar4 != (char *)0x0) {
    iVar2 = atoi(pcVar4);
  }
  iVar1 = window_height;
  screen_height = iVar2;
  pcVar4 = (char *)al_get_config_value(lVar3,"GFX","window_width");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  iVar2 = screen_height;
  window_width = iVar1;
  pcVar4 = (char *)al_get_config_value(lVar3,"GFX","window_height");
  if (pcVar4 != (char *)0x0) {
    iVar2 = atoi(pcVar4);
  }
  iVar1 = screen_samples;
  window_height = iVar2;
  pcVar4 = (char *)al_get_config_value(lVar3,"GFX","samples");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  iVar2 = use_vsync;
  screen_samples = iVar1;
  pcVar4 = (char *)al_get_config_value(lVar3,"GFX","vsync");
  if (pcVar4 != (char *)0x0) {
    iVar2 = atoi(pcVar4);
  }
  iVar1 = logic_framerate;
  use_vsync = iVar2;
  pcVar4 = (char *)al_get_config_value(lVar3,"TIMING","logic_framerate");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  iVar2 = limit_framerate;
  logic_framerate = iVar1;
  pcVar4 = (char *)al_get_config_value(lVar3,"TIMING","limit_framerate");
  if (pcVar4 != (char *)0x0) {
    iVar2 = atoi(pcVar4);
  }
  iVar1 = max_frame_skip;
  limit_framerate = iVar2;
  pcVar4 = (char *)al_get_config_value(lVar3,"TIMING","max_frame_skip");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  iVar2 = display_framerate;
  max_frame_skip = iVar1;
  pcVar4 = (char *)al_get_config_value(lVar3,"TIMING","display_framerate");
  if (pcVar4 != (char *)0x0) {
    iVar2 = atoi(pcVar4);
  }
  iVar1 = reduce_cpu_usage;
  display_framerate = iVar2;
  pcVar4 = (char *)al_get_config_value(lVar3,"TIMING","reduce_cpu_usage");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  iVar2 = sound_volume;
  reduce_cpu_usage = iVar1;
  pcVar4 = (char *)al_get_config_value(lVar3,"SOUND","sound_volume");
  if (pcVar4 != (char *)0x0) {
    iVar2 = atoi(pcVar4);
  }
  iVar1 = music_volume;
  sound_volume = iVar2;
  pcVar4 = (char *)al_get_config_value(lVar3,"SOUND","music_volume");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  music_volume = iVar1;
  set_sound_volume((double)sound_volume / 10.0);
  set_music_volume((double)music_volume / 10.0);
  iVar1 = controller_id;
  pcVar4 = (char *)al_get_config_value(lVar3,"CONTROLS","controller_id");
  if (pcVar4 != (char *)0x0) {
    iVar1 = atoi(pcVar4);
  }
  controller_id = iVar1;
  al_destroy_config(lVar3);
  return;
}

Assistant:

void read_global_config(const char *config)
{
   ALLEGRO_CONFIG *c = al_load_config_file(config);
   if (!c) c = al_create_config();

   fullscreen = get_config_int(c, "GFX", "fullscreen", fullscreen);
   bit_depth = get_config_int(c, "GFX", "bit_depth", bit_depth);
   screen_width = get_config_int(c, "GFX", "screen_width", screen_width);
   screen_height = get_config_int(c, "GFX", "screen_height", screen_height);
   window_width = get_config_int(c, "GFX", "window_width", window_height);
   window_height = get_config_int(c, "GFX", "window_height", screen_height);
   screen_samples = get_config_int(c, "GFX", "samples", screen_samples);
   use_vsync = get_config_int(c, "GFX", "vsync", use_vsync);

   logic_framerate =
      get_config_int(c, "TIMING", "logic_framerate", logic_framerate);
   limit_framerate =
      get_config_int(c, "TIMING", "limit_framerate", limit_framerate);
   max_frame_skip =
      get_config_int(c, "TIMING", "max_frame_skip", max_frame_skip);
   display_framerate =
      get_config_int(c, "TIMING", "display_framerate", display_framerate);
   reduce_cpu_usage =
      get_config_int(c, "TIMING", "reduce_cpu_usage", reduce_cpu_usage);

   sound_volume = get_config_int(c, "SOUND", "sound_volume", sound_volume);
   music_volume = get_config_int(c, "SOUND", "music_volume", music_volume);
   
   set_sound_volume(sound_volume / 10.0);
   set_music_volume(music_volume / 10.0);

   controller_id = get_config_int(c, "CONTROLS", "controller_id", controller_id);
   
   al_destroy_config(c);
}